

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment)

{
  pointer pbVar1;
  char *pcVar2;
  cmsysProcess *pcVar3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  string *file2;
  pointer ppcVar9;
  SaveRestoreEnvironment *pSVar10;
  size_t sVar11;
  undefined1 extraout_DL;
  undefined1 collapse;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  ulong uVar13;
  cmCTest *this_00;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  double dVar17;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  char *data;
  ostringstream oss;
  ostringstream msg;
  ostringstream cmCTestLog_msg;
  cmsysProcess *local_918;
  undefined8 local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  cmsysProcess *local_8e8;
  undefined8 uStack_8e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  int *local_8c0;
  ostream *local_8b8;
  cmCTest *local_8b0;
  long *local_8a8 [2];
  long local_898 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_888;
  long *local_880 [2];
  long local_870 [12];
  ios_base local_810 [264];
  undefined1 local_708 [112];
  ios_base local_698 [264];
  undefined1 local_590 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [6];
  ios_base local_520 [1016];
  double local_128;
  ostringstream *local_b0;
  ostringstream *local_a8;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_910 = (SaveRestoreEnvironment *)((ulong)local_910._4_4_ << 0x20);
  }
  else {
    pbVar1 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_910 = (SaveRestoreEnvironment *)
                CONCAT44(local_910._4_4_,
                         (int)CONCAT71((int7)((ulong)pbVar1 >> 8),
                                       pbVar1 != (environment->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish));
  }
  local_918 = (cmsysProcess *)testTimeOut;
  local_8c0 = retVal;
  dVar15 = GetRemainingTimeAllowed(this);
  dVar15 = dVar15 + -120.0;
  dVar16 = this->TimeOut;
  dVar17 = dVar16;
  if (dVar15 <= dVar16) {
    dVar17 = dVar15;
  }
  local_8e8 = (cmsysProcess *)
              (~-(ulong)(0.0 < dVar16) & (ulong)dVar15 | (ulong)dVar17 & -(ulong)(0.0 < dVar16));
  uStack_8e0 = extraout_XMM0_Qb;
  local_8b8 = log;
  if ((0.0 < (double)local_918) &&
     (dVar16 = GetRemainingTimeAllowed(this), (double)local_918 < dVar16)) {
    local_8e8 = local_918;
    uStack_8e0 = 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"Test timeout computed to be: ",0x1d);
  local_8e8 = (cmsysProcess *)
              (~-(ulong)(0.0 < (double)local_8e8) & 0x3ff0000000000000 |
              (ulong)local_8e8 & -(ulong)(0.0 < (double)local_8e8));
  poVar8 = std::ostream::_M_insert<double>((double)local_8e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x52a,(char *)local_880[0],false);
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  std::__cxx11::string::string
            ((string *)local_590,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator *)local_880);
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar5 = cmsys::SystemTools::SameFile((string *)local_590,file2);
  if (bVar5) {
    bVar5 = this->ForceNewCTestProcess;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
    }
    if (bVar5 == false) {
      cmCTest((cmCTest *)local_590);
      std::__cxx11::string::_M_assign((string *)(local_590 + 8));
      local_128 = (double)local_8e8;
      local_918 = (cmsysProcess *)output;
      local_8b0 = this;
      local_888 = environment;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_880);
      collapse = (undefined1)extraout_RDX;
      local_8d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_8d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_8d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_b0 = (ostringstream *)local_880;
      local_a8 = (ostringstream *)local_880;
      if ((argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppcVar9) {
        pcVar2 = local_708 + 0x10;
        uVar12 = extraout_RDX;
        uVar13 = 0;
        uVar14 = 1;
        do {
          if (ppcVar9[uVar13] != (char *)0x0) {
            iVar6 = strcmp(ppcVar9[uVar13],"--build-generator");
            if ((0.0 < (double)local_8e8) && (iVar6 == 0)) {
              local_708._0_8_ = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_708,"--test-timeout","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_8d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_708);
              if ((char *)local_708._0_8_ != pcVar2) {
                operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
              std::ostream::_M_insert<double>((double)local_8e8);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_8d8,&local_908);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_908._M_dataplus._M_p != &local_908.field_2) {
                operator_delete(local_908._M_dataplus._M_p,
                                local_908.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
              std::ios_base::~ios_base(local_698);
            }
            std::__cxx11::string::string
                      ((string *)local_708,
                       (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar13],(allocator *)&local_908);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_8d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_708);
            uVar12 = extraout_RDX_00;
            if ((char *)local_708._0_8_ != pcVar2) {
              operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              uVar12 = extraout_RDX_01;
            }
          }
          collapse = (undefined1)uVar12;
          ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          bVar5 = uVar14 < (ulong)((long)(argv->
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar9
                                  >> 3);
          uVar13 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar5);
      }
      poVar8 = local_8b8;
      if (local_8b8 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_8b8,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        collapse = extraout_DL;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_908,(SystemTools *)&DAT_00000001,(bool)collapse);
      pcVar3 = local_918;
      if ((char)local_910 == '\0') {
        pSVar10 = (SaveRestoreEnvironment *)0x0;
        this_00 = local_8b0;
      }
      else {
        pSVar10 = (SaveRestoreEnvironment *)operator_new(0x20);
        this_00 = local_8b0;
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
        cmSystemTools::AppendEnv(local_888);
      }
      iVar6 = Run((cmCTest *)local_590,&local_8d8,(string *)pcVar3);
      *local_8c0 = iVar6;
      if (pcVar3 != (cmsysProcess *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)pcVar3,local_708._0_8_);
        if ((undefined1 *)local_708._0_8_ != local_708 + 0x10) {
          operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
        }
      }
      if (poVar8 != (ostream *)0x0 && pcVar3 != (cmsysProcess *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,((_Alloc_hider *)&pcVar3->Commands)->_M_p,
                   *(size_type *)&pcVar3->NumberOfCommands);
      }
      cmsys::SystemTools::ChangeDirectory(&local_908);
      if (pcVar3 != (cmsysProcess *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_708,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_708 + (char)*(undefined8 *)(local_708._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_708);
        poVar8 = (ostream *)std::ostream::flush();
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((_Alloc_hider *)&pcVar3->Commands)->_M_p,
                            *(size_type *)&pcVar3->NumberOfCommands);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this_00,4,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0x564,(char *)local_8a8[0],false);
        if (local_8a8[0] != local_898) {
          operator_delete(local_8a8[0],local_898[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
        std::ios_base::~ios_base(local_698);
      }
      if (pSVar10 != (SaveRestoreEnvironment *)0x0) {
        (*pSVar10->_vptr_SaveRestoreEnvironment[1])(pSVar10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_8d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_880);
      std::ios_base::~ios_base(local_810);
      ~cmCTest((cmCTest *)local_590);
      return 4;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_590._0_8_ != local_580) {
    operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
  }
  local_908._M_dataplus._M_p = (pointer)0x0;
  local_908._M_string_length = 0;
  local_908.field_2._M_allocated_capacity = 0;
  if (output != (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)output,0,(char *)output->_M_string_length,0x5fa2a3);
  }
  if ((char)local_910 == '\0') {
    pSVar10 = (SaveRestoreEnvironment *)0x0;
  }
  else {
    pSVar10 = (SaveRestoreEnvironment *)operator_new(0x20);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
    cmSystemTools::AppendEnv(environment);
  }
  local_918 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (local_918,
             (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  local_910 = pSVar10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,"Command is: ",0xc);
  pcVar2 = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_918 + (int)*(undefined8 *)(local_590._0_8_ + -0x18) + 0x388);
  }
  else {
    sVar11 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,pcVar2,sVar11);
  }
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x578,(char *)local_880[0],false);
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  pcVar3 = local_918;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_918,0,1);
  }
  cmsysProcess_SetTimeout(pcVar3,(double)local_8e8);
  cmsysProcess_Execute(pcVar3);
  while (iVar6 = cmsysProcess_WaitForData
                           (local_918,(char **)local_8a8,(int *)&local_8d8,(double *)0x0),
        pcVar3 = local_918, iVar6 != 0) {
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_908,local_908._M_string_length,
                 local_8a8[0],
                 (long)local_8a8[0] +
                 (long)(int)local_8d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    if ((int)local_8d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != 0) {
      std::ostream::write((char *)local_590,(long)local_8a8[0]);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x589,(char *)local_880[0],false);
    if (local_880[0] != local_870) {
      operator_delete(local_880[0],local_870[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
    std::ios_base::~ios_base(local_520);
    if (local_8b8 != (ostream *)0x0) {
      std::ostream::write((char *)local_8b8,(long)local_8a8[0]);
    }
  }
  cmsysProcess_WaitForExit(local_918,(double *)0x0);
  pSVar10 = local_910;
  if ((output != (string *)0x0) &&
     (local_908._M_dataplus._M_p != (pointer)local_908._M_string_length)) {
    std::__cxx11::string::append((char *)output,(ulong)local_908._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x596,(char *)local_880[0],false);
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  iVar6 = cmsysProcess_GetState(pcVar3);
  if (iVar6 == 1) {
    local_880[0] = local_870;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_880,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(pcVar3);
    std::__cxx11::string::append((char *)local_880);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_880[0]);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    plVar4 = local_880[0];
    if (local_880[0] == (long *)0x0) {
      std::ios::clear((int)&local_918 + (int)*(undefined8 *)(local_590._0_8_ + -0x18) + 0x388);
    }
    else {
      sVar11 = strlen((char *)local_880[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,(char *)plVar4,sVar11)
      ;
    }
    std::ios::widen((char)(ostringstream *)local_590 +
                    (char)*(undefined8 *)(local_590._0_8_ + -0x18));
    std::ostream::put((char)local_590);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x5bb,(char *)local_708._0_8_,false);
  }
  else {
    if (iVar6 != 2) {
      if (iVar6 == 4) {
        iVar7 = cmsysProcess_GetExitValue(pcVar3);
        *local_8c0 = iVar7;
        if ((iVar7 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&local_908);
        }
      }
      goto LAB_00260fe0;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&local_908);
    }
    iVar7 = cmsysProcess_GetExitException(pcVar3);
    *local_8c0 = iVar7;
    local_880[0] = local_870;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_880,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(pcVar3);
    std::__cxx11::string::append((char *)local_880);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_880[0]);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    plVar4 = local_880[0];
    if (local_880[0] == (long *)0x0) {
      std::ios::clear((int)&local_918 + (int)*(undefined8 *)(local_590._0_8_ + -0x18) + 0x388);
    }
    else {
      sVar11 = strlen((char *)local_880[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,(char *)plVar4,sVar11)
      ;
    }
    std::ios::widen((char)(ostringstream *)local_590 +
                    (char)*(undefined8 *)(local_590._0_8_ + -0x18));
    std::ostream::put((char)local_590);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x5b0,(char *)local_708._0_8_,false);
  }
  if ((undefined1 *)local_708._0_8_ != local_708 + 0x10) {
    operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
LAB_00260fe0:
  cmsysProcess_Delete(pcVar3);
  if (pSVar10 != (SaveRestoreEnvironment *)0x0) {
    (*pSVar10->_vptr_SaveRestoreEnvironment[1])(pSVar10);
  }
  if (local_908._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_908._M_dataplus._M_p,
                    local_908.field_2._M_allocated_capacity - (long)local_908._M_dataplus._M_p);
  }
  return iVar6;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv,
                     std::string* output, int *retVal,
                     std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout)
    {
    timeout = this->TimeOut;
    }
  if (testTimeOut > 0
      && testTimeOut < this->GetRemainingTimeAllowed())
    {
    timeout = testTimeOut;
    }

  // always have at least 1 second if we got to here
  if (timeout <= 0)
    {
    timeout = 1;
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if(cmSystemTools::SameFile(
       argv[0], cmSystemTools::GetCTestCommand()) &&
     !this->ForceNewCTestProcess)
    {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for(unsigned int i =0; i < argv.size(); ++i)
      {
      if(argv[i])
        {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i],"--build-generator") == 0 && timeout > 0)
          {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
          }
        args.push_back(argv[i]);
        }
      }
    if ( log )
      {
      *log << "* Run internal CTest" << std::endl;
      }
    std::string oldpath = cmSystemTools::GetCurrentWorkingDirectory();

    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv)
      {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
      }

    *retVal = inst.Run(args, output);
    if(output)
      {
      *output += oss.str();
      }
    if ( log && output)
      {
      *log << *output;
      }
    cmSystemTools::ChangeDirectory(oldpath);
    if(output)
      {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                 <<  *output << std::endl);
      }

    return cmsysProcess_State_Exited;
    }
  std::vector<char> tempOutput;
  if ( output )
    {
    *output = "";
    }

  cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv)
    {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    if ( output )
      {
      tempOutput.insert(tempOutput.end(), data, data+length);
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( log )
      {
      log->write(data, length);
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if(output && tempOutput.begin() != tempOutput.end())
    {
    output->append(&*tempOutput.begin(), tempOutput.size());
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
    << std::endl);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    if(*retVal != 0 && this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    }
  else if(result == cmsysProcess_State_Exception)
    {
    if(this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  else if(result == cmsysProcess_State_Error)
    {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  cmsysProcess_Delete(cp);

  return result;
}